

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * QByteArray::fromHex(QByteArray *__return_storage_ptr__,QByteArray *hexEncoded)

{
  byte bVar1;
  Data *pDVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  byte *pbVar6;
  uint uVar7;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(__return_storage_ptr__,(hexEncoded->d).size + 1U >> 1,Uninitialized);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  pbVar6 = (byte *)((__return_storage_ptr__->d).ptr + (__return_storage_ptr__->d).size);
  lVar3 = (hexEncoded->d).size;
  if (lVar3 != 0) {
    uVar4 = lVar3 + 1;
    bVar5 = true;
    do {
      bVar1 = (hexEncoded->d).ptr[uVar4 - 2];
      uVar7 = bVar1 - 0x30;
      if (uVar7 < 10) {
LAB_0030436b:
        if (bVar5) {
          pbVar6[-1] = (byte)uVar7;
          pbVar6 = pbVar6 + -1;
          bVar5 = false;
        }
        else {
          *pbVar6 = *pbVar6 | (byte)uVar7 << 4;
          bVar5 = true;
        }
      }
      else {
        if (bVar1 - 0x41 < 6) {
          uVar7 = bVar1 - 0x37;
          goto LAB_0030436b;
        }
        if (0xfffffff9 < bVar1 - 0x67) {
          uVar7 = bVar1 - 0x57;
          goto LAB_0030436b;
        }
      }
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  remove(__return_storage_ptr__,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::fromHex(const QByteArray &hexEncoded)
{
    QByteArray res((hexEncoded.size() + 1)/ 2, Qt::Uninitialized);
    uchar *result = (uchar *)res.data() + res.size();

    bool odd_digit = true;
    for (qsizetype i = hexEncoded.size() - 1; i >= 0; --i) {
        uchar ch = uchar(hexEncoded.at(i));
        int tmp = QtMiscUtils::fromHex(ch);
        if (tmp == -1)
            continue;
        if (odd_digit) {
            --result;
            *result = tmp;
            odd_digit = false;
        } else {
            *result |= tmp << 4;
            odd_digit = true;
        }
    }

    res.remove(0, result - (const uchar *)res.constData());
    return res;
}